

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O2

uchar * __thiscall
icu_63::LocalMemory<unsigned_char>::allocateInsteadAndCopy
          (LocalMemory<unsigned_char> *this,int32_t newCapacity,int32_t length)

{
  uchar *__src;
  uchar *__dest;
  
  if ((0 < newCapacity) &&
     (__dest = (uchar *)uprv_malloc_63((ulong)(uint)newCapacity), __dest != (uchar *)0x0)) {
    __src = (this->super_LocalPointerBase<unsigned_char>).ptr;
    if (0 < length) {
      if ((uint)length < (uint)newCapacity) {
        newCapacity = length;
      }
      memcpy(__dest,__src,(ulong)(uint)newCapacity);
    }
    uprv_free_63(__src);
    (this->super_LocalPointerBase<unsigned_char>).ptr = __dest;
    return __dest;
  }
  return (uchar *)0x0;
}

Assistant:

inline T *LocalMemory<T>::allocateInsteadAndCopy(int32_t newCapacity, int32_t length) {
    if(newCapacity>0) {
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            if(length>0) {
                if(length>newCapacity) {
                    length=newCapacity;
                }
                uprv_memcpy(p, LocalPointerBase<T>::ptr, (size_t)length*sizeof(T));
            }
            uprv_free(LocalPointerBase<T>::ptr);
            LocalPointerBase<T>::ptr=p;
        }
        return p;
    } else {
        return NULL;
    }
}